

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

ngx_int_t ngx_memn2cmp(u_char *s1,u_char *s2,size_t n1,size_t n2)

{
  int iVar1;
  u_char *local_48;
  ngx_int_t z;
  ngx_int_t m;
  size_t n;
  size_t n2_local;
  size_t n1_local;
  u_char *s2_local;
  u_char *s1_local;
  
  if (n2 < n1) {
    local_48 = &DAT_00000001;
    m = n2;
  }
  else {
    local_48 = (u_char *)0xffffffffffffffff;
    m = n1;
  }
  iVar1 = memcmp(s1,s2,m);
  s1_local = (u_char *)(long)iVar1;
  if ((s1_local == (u_char *)0x0) && (n1 != n2)) {
    s1_local = local_48;
  }
  return (ngx_int_t)s1_local;
}

Assistant:

ngx_int_t
ngx_memn2cmp(u_char *s1, u_char *s2, size_t n1, size_t n2)
{
    size_t     n;
    ngx_int_t  m, z;

    if (n1 <= n2) {
        n = n1;
        z = -1;

    } else {
        n = n2;
        z = 1;
    }

    m = ngx_memcmp(s1, s2, n);

    if (m || n1 == n2) {
        return m;
    }

    return z;
}